

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.h
# Opt level: O2

int nsync_pthread_rwlock_wrlock_(nsync_pthread_rwlock_ *rw)

{
  nsync_pthread_rwlock_ pnVar1;
  int extraout_EAX;
  unique_lock<std::mutex> rw_mu;
  unique_lock<std::mutex> local_20;
  
  local_20._M_device = &(*rw)->mu;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  while (pnVar1 = *rw, pnVar1->lock != 0) {
    std::condition_variable::wait((unique_lock *)&pnVar1->cv);
  }
  pnVar1->lock = -1;
  std::unique_lock<std::mutex>::unlock(&local_20);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return extraout_EAX;
}

Assistant:

static inline int nsync_pthread_rwlock_wrlock_ (nsync_pthread_rwlock_ *rw) {
	std::unique_lock<std::mutex> rw_mu ((*rw)->mu, std::defer_lock);
	rw_mu.lock ();
	while ((*rw)->lock != 0) {
		(*rw)->cv.wait (rw_mu);
	}
	(*rw)->lock = -1;
	rw_mu.unlock ();
	return (0);
}